

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int __thiscall miniros::console::Formatter::init(Formatter *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  string *in_stack_00000088;
  string token;
  string last_suffix;
  bool matched_once;
  const_iterator end;
  const_iterator start;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  results;
  regex e;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe18;
  shared_ptr<miniros::console::FixedToken> *__r;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe20;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe28;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  flag_type __f;
  string *this_00;
  char *in_stack_fffffffffffffe58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe60;
  shared_ptr<miniros::console::FixedToken> local_168 [5];
  undefined1 local_118 [48];
  string local_e8 [32];
  char *local_c8;
  char *local_c0;
  string local_b8 [39];
  byte local_91;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [11];
  EVP_PKEY_CTX *local_10;
  Formatter *local_8;
  
  __f = (flag_type)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_10 = ctx;
  local_8 = this;
  std::__cxx11::string::operator=((string *)this,(char *)ctx);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,__f);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffe20);
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(local_68);
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&local_70);
  local_80 = std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe20,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe18);
  local_68[0]._M_current = local_78;
  local_90 = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe20,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe18);
  local_70._M_current = local_88;
  local_91 = 0;
  std::__cxx11::string::string(local_b8);
  while( true ) {
    local_c0 = local_68[0]._M_current;
    local_c8 = local_70._M_current;
    bVar1 = std::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
                       ,in_stack_fffffffffffffe28,
                       (match_flag_type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    if (!bVar1) break;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
    std::__cxx11::sub_match::operator_cast_to_string(in_stack_fffffffffffffe18);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::suffix((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)in_stack_fffffffffffffe20);
    std::__cxx11::sub_match::operator_cast_to_string(in_stack_fffffffffffffe18);
    this_00 = (string *)(local_118 + 0x10);
    std::__cxx11::string::operator=(local_b8,this_00);
    std::__cxx11::string::~string(this_00);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::prefix((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)in_stack_fffffffffffffe20);
    std::
    make_shared<miniros::console::FixedToken,std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&>
              ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe48 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    std::shared_ptr<miniros::console::Token>::shared_ptr<miniros::console::FixedToken,void>
              ((shared_ptr<miniros::console::Token> *)in_stack_fffffffffffffe20,
               (shared_ptr<miniros::console::FixedToken> *)in_stack_fffffffffffffe18);
    std::
    vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
    ::push_back((vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                 *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
    std::shared_ptr<miniros::console::Token>::~shared_ptr
              ((shared_ptr<miniros::console::Token> *)0x3e32e8);
    std::shared_ptr<miniros::console::FixedToken>::~shared_ptr
              ((shared_ptr<miniros::console::FixedToken> *)0x3e32f5);
    in_stack_fffffffffffffe40._M_current = (char *)&this->tokens_;
    createTokenFromType(in_stack_00000088);
    std::
    vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
    ::push_back((vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                 *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
    std::shared_ptr<miniros::console::Token>::~shared_ptr
              ((shared_ptr<miniros::console::Token> *)0x3e333b);
    in_stack_fffffffffffffe38._M_current =
         (char *)std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
    local_68[0]._M_current =
         (((const_reference)in_stack_fffffffffffffe38._M_current)->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).second._M_current;
    local_91 = 1;
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_91 & 1) == 0) {
    in_stack_fffffffffffffe20 =
         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&this->tokens_;
    std::make_shared<miniros::console::FixedToken,std::__cxx11::string&>(in_stack_fffffffffffffe48);
    __r = local_168;
    std::shared_ptr<miniros::console::Token>::shared_ptr<miniros::console::FixedToken,void>
              ((shared_ptr<miniros::console::Token> *)in_stack_fffffffffffffe20,__r);
    std::
    vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
    ::push_back((vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                 *)in_stack_fffffffffffffe20,(value_type *)__r);
    std::shared_ptr<miniros::console::Token>::~shared_ptr
              ((shared_ptr<miniros::console::Token> *)0x3e3529);
    std::shared_ptr<miniros::console::FixedToken>::~shared_ptr
              ((shared_ptr<miniros::console::FixedToken> *)0x3e3533);
  }
  else {
    std::make_shared<miniros::console::FixedToken,std::__cxx11::string&>(in_stack_fffffffffffffe48);
    std::shared_ptr<miniros::console::Token>::shared_ptr<miniros::console::FixedToken,void>
              ((shared_ptr<miniros::console::Token> *)in_stack_fffffffffffffe20,
               (shared_ptr<miniros::console::FixedToken> *)in_stack_fffffffffffffe18);
    std::
    vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
    ::push_back((vector<std::shared_ptr<miniros::console::Token>,_std::allocator<std::shared_ptr<miniros::console::Token>_>_>
                 *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
    std::shared_ptr<miniros::console::Token>::~shared_ptr
              ((shared_ptr<miniros::console::Token> *)0x3e3494);
    std::shared_ptr<miniros::console::FixedToken>::~shared_ptr
              ((shared_ptr<miniros::console::FixedToken> *)0x3e34a1);
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x3e357c);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (in_stack_fffffffffffffe20);
  return extraout_EAX;
}

Assistant:

void Formatter::init(const char* fmt)
{
  format_ = fmt;

  std::regex e("\\$\\{([^\\}]+)\\}");
  std::match_results<std::string::const_iterator> results;
  std::string::const_iterator start, end;
  start = format_.begin();
  end = format_.end();
  bool matched_once = false;
  std::string last_suffix;
  while (std::regex_search(start, end, results, e))
  {
#if 0
    for (size_t i = 0; i < results.size(); ++i)
    {
      std::cout << i << "|" << results.prefix() << "|" <<  results[i] << "|" << results.suffix() << std::endl;
    }
#endif

    std::string token = results[1];
    last_suffix = results.suffix();
    tokens_.push_back(TokenPtr(std::make_shared<FixedToken>(results.prefix())));
    tokens_.push_back(createTokenFromType(token));

    start = results[0].second;
    matched_once = true;
  }

  if (matched_once)
  {
    tokens_.push_back(TokenPtr(std::make_shared<FixedToken>(last_suffix)));
  }
  else
  {
    tokens_.push_back(TokenPtr(std::make_shared<FixedToken>(format_)));
  }
}